

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O0

int displayMessage(char *msg_buffer)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  int y_00;
  int x_00;
  undefined8 uStack_60;
  char acStack_58 [8];
  char *local_50;
  int local_44;
  char *pcStack_40;
  int ch;
  char *c;
  int sx;
  int y;
  int x;
  int line_count;
  int width;
  int max_line_width;
  unsigned_long __vla_expr0;
  char *local_10;
  char *msg_buffer_local;
  
  uStack_60 = 0x12adb5;
  local_10 = msg_buffer;
  sVar4 = strlen(msg_buffer);
  pcVar3 = local_10;
  _width = sVar4 + 0x20;
  lVar2 = -(sVar4 + 0x2f & 0xfffffffffffffff0);
  local_50 = acStack_58 + lVar2;
  __vla_expr0 = (unsigned_long)acStack_58;
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12ade8;
  strcpy(acStack_58 + lVar2,pcVar3);
  pcVar3 = local_50;
  line_count = 0x15;
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12ae0a;
  lineWrapString(pcVar3,0x15,"",&x,&y);
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12ae0f;
  drawMap();
  c._0_4_ = (x * -4 + 0x80) / 2;
  c._4_4_ = (y * -6 + 0x40) / 2;
  x_00 = (int)c + -2;
  y_00 = c._4_4_ + -2;
  iVar6 = x * 4;
  iVar5 = y * 6;
  sx = (int)c;
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12ae6a;
  fillBox(x_00,y_00,iVar6 + 4,iVar5 + 5,0xff);
  iVar6 = sx + -1;
  iVar5 = c._4_4_ + -1;
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12ae8e;
  fillBox(iVar6,iVar5,x * 4 + 2,y * 6 + 2,'\0');
  for (pcStack_40 = local_50; iVar6 = sx, iVar5 = c._4_4_, *pcStack_40 != '\0';
      pcStack_40 = pcStack_40 + 1) {
    if (*pcStack_40 == '\n') {
      sx = (int)c;
      c._4_4_ = c._4_4_ + 6;
    }
    else {
      cVar1 = *pcStack_40;
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12aece;
      drawChar(iVar6,iVar5,(int)cVar1);
      sx = sx + 4;
    }
  }
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12aeec;
  refreshDisplay();
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12aef1;
  local_44 = md_readchar();
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12aef9;
  refreshMap();
  return local_44;
}

Assistant:

int displayMessage(const char* msg_buffer)
{
    char buffer[strlen(msg_buffer) + 32];
    strcpy(buffer, msg_buffer);
    
    int max_line_width = (DISPLAY_WIDTH * 2 / 3) / 4;
    int width, line_count;
    lineWrapString(buffer, max_line_width, "", &width, &line_count);
    
    drawMap();
    int x = (DISPLAY_WIDTH - width * 4) / 2;
    int y = (DISPLAY_HEIGHT - line_count * 6) / 2;
    int sx = x;
    fillBox(x - 2, y - 2, width * 4 + 4, line_count * 6 + 5, 255);
    fillBox(x - 1, y - 1, width * 4 + 2, line_count * 6 + 2, 0);
    for(const char* c=buffer; *c; c++)
    {
        if (*c == '\n')
        {
            x = sx;
            y += 6;
        }else{
            drawChar(x, y, *c);
            x += 4;
        }
    }
    
    refreshDisplay();
    int ch = md_readchar();
    refreshMap();
    return ch;
}